

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Vec_Int_t * Cba_NtkCollectDfs(Cba_Ntk_t *p)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  iVar5 = (p->vObjType).nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar5 - 2U) {
    iVar4 = iVar5 + -1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < (p->vInputs).nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(p_00,(p->vInputs).pArray[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vInputs).nSize);
  }
  if (0 < (p->vSeq).nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(p_00,(p->vSeq).pArray[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vSeq).nSize);
  }
  uVar1 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar1) {
    piVar2 = (p->vObjCopy).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)(int)uVar1 << 2);
    }
    (p->vObjCopy).pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vObjCopy).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar1 * 4);
  }
  (p->vObjCopy).nSize = uVar1;
  iVar5 = p_00->nSize;
  if (0 < (long)iVar5) {
    piVar2 = p_00->pArray;
    lVar8 = 0;
    do {
      Cba_ObjSetCopy(p,piVar2[lVar8],0);
      lVar8 = lVar8 + 1;
    } while (iVar5 != lVar8);
  }
  if (0 < (p->vOutputs).nSize) {
    lVar8 = 0;
    do {
      uVar1 = (p->vOutputs).pArray[lVar8];
      if ((int)uVar1 < 1) goto LAB_00335781;
      if (((p->vObjFin0).nSize <= (int)uVar1) || ((p->vObjFin0).nSize <= (int)(uVar1 + 1)))
      goto LAB_00335743;
      uVar6 = (p->vObjFin0).pArray[uVar1];
      uVar7 = (ulong)uVar6;
      while ((int)uVar7 < (p->vObjFin0).pArray[(ulong)uVar1 + 1]) {
        if ((int)uVar6 < 1) goto LAB_00335762;
        if ((p->vFinFon).nSize <= (int)uVar7) goto LAB_00335743;
        iVar5 = (p->vFinFon).pArray[uVar7];
        if ((long)iVar5 < 1) {
          iVar5 = 0;
        }
        else {
          if ((p->vFonObj).nSize <= iVar5) goto LAB_00335743;
          iVar5 = (p->vFonObj).pArray[iVar5];
        }
        if (iVar5 != 0) {
          Cba_NtkCollectDfs_rec(p,iVar5,p_00);
        }
        uVar7 = uVar7 + 1;
        if ((p->vObjFin0).nSize <= (int)(uVar1 + 1)) goto LAB_00335743;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vOutputs).nSize);
  }
  if (0 < (p->vSeq).nSize) {
    lVar8 = 0;
    do {
      uVar1 = (p->vSeq).pArray[lVar8];
      if ((int)uVar1 < 1) {
LAB_00335781:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x154,"int Cba_ObjFin0(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFin0).nSize <= (int)uVar1) || ((p->vObjFin0).nSize <= (int)(uVar1 + 1)))
      goto LAB_00335743;
      uVar6 = (p->vObjFin0).pArray[uVar1];
      uVar7 = (ulong)uVar6;
      while ((int)uVar7 < (p->vObjFin0).pArray[(ulong)uVar1 + 1]) {
        if ((int)uVar6 < 1) {
LAB_00335762:
          __assert_fail("f>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
        }
        if ((p->vFinFon).nSize <= (int)uVar7) goto LAB_00335743;
        iVar5 = (p->vFinFon).pArray[uVar7];
        if ((long)iVar5 < 1) {
          iVar5 = 0;
        }
        else {
          if ((p->vFonObj).nSize <= iVar5) goto LAB_00335743;
          iVar5 = (p->vFonObj).pArray[iVar5];
        }
        if (iVar5 != 0) {
          Cba_NtkCollectDfs_rec(p,iVar5,p_00);
        }
        uVar7 = uVar7 + 1;
        if ((p->vObjFin0).nSize <= (int)(uVar1 + 1)) goto LAB_00335743;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vSeq).nSize);
  }
  if (0 < (p->vOutputs).nSize) {
    lVar8 = 0;
    do {
      Vec_IntPush(p_00,(p->vOutputs).pArray[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vOutputs).nSize);
  }
  uVar1 = p_00->nSize;
  iVar5 = (p->vObjType).nSize;
  if (iVar5 <= (int)uVar1) {
    __assert_fail("Vec_IntSize(vObjs) <= Cba_NtkObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x296,"Vec_Int_t *Cba_NtkCollectDfs(Cba_Ntk_t *)");
  }
  uVar6 = iVar5 - 1;
  if (uVar1 != uVar6) {
    uVar6 = Cba_NtkFindMissing(p_00,uVar6);
    pcVar3 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
    printf("Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n",pcVar3,
           (ulong)uVar1,(ulong)((p->vObjType).nSize - 1));
    if ((int)uVar6 < 1) {
      pcVar3 = "<unknown>";
    }
    else {
      if ((p->vObjFon0).nSize <= (int)uVar6) {
LAB_00335743:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((p->vFonName).nSize < 1) {
        pcVar3 = "Cba_NtkHasFonNames(p)";
LAB_003357ee:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
      }
      uVar1 = (p->vObjFon0).pArray[uVar6];
      if ((int)uVar1 < 1) {
        pcVar3 = "Cba_FonIsReal(f)";
        goto LAB_003357ee;
      }
      Vec_IntFillExtra(&p->vFonName,uVar1 + 1,0);
      if ((p->vFonName).nSize <= (int)uVar1) goto LAB_00335743;
      pcVar3 = Abc_NamStr(p->pDesign->pStrs,(p->vFonName).pArray[uVar1]);
    }
    printf("         For example, object %d with name \"%s\" is not reachable from outputs.\n",
           (ulong)uVar6,pcVar3);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cba_NtkCollectDfs( Cba_Ntk_t * p )
{
    int i, k, iObj, iFin, iFanin;
    Vec_Int_t * vObjs = Vec_IntAlloc( Cba_NtkObjNum(p) );
    // collect PIs and seq boxes
    Cba_NtkForEachPi( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    // prepare leaves
    Cba_NtkCleanObjCopies( p );
    Vec_IntForEachEntry( vObjs, iObj, i )
        Cba_ObjSetCopy( p, iObj, 0 );
    // collect internal
    Cba_NtkForEachPo( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Cba_ObjForEachFinFaninReal( p, iObj, iFin, iFanin, k )
            Cba_NtkCollectDfs_rec( p, iFanin, vObjs );
    // collect POs
    Cba_NtkForEachPo( p, iObj, i )
        Vec_IntPush( vObjs, iObj );
    assert( Vec_IntSize(vObjs) <= Cba_NtkObjNum(p) );
    if ( Vec_IntSize(vObjs) != Cba_NtkObjNum(p) )
    {
        int iObj = Cba_NtkFindMissing( vObjs, Cba_NtkObjNum(p) );
        printf( "Warning: DSF ordering for module \"%s\" collected %d out of %d objects.\n", Cba_NtkName(p), Vec_IntSize(vObjs), Cba_NtkObjNum(p) );
        printf( "         For example, object %d with name \"%s\" is not reachable from outputs.\n", 
            iObj, iObj > 0 ? Cba_FonNameStr( p, Cba_ObjFon0(p, iObj) ) : "<unknown>" );
    }
    return vObjs;
}